

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

void __thiscall soinn::ESOINN::classify(ESOINN *this)

{
  StoredVertexList *pSVar1;
  int iVar2;
  _List_node_base *p_Var3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  comp_type c_count;
  vertex_descriptor v;
  arg_pack_type arg_pack;
  ComponentMap component;
  undefined1 local_7d;
  int local_7c;
  _List_node_base *local_78;
  _Rb_tree<void_*,_std::pair<void_*const,_int>,_std::_Select1st<std::pair<void_*const,_int>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
  *local_70;
  int *local_68;
  arg_list<boost::parameter::aux::tagged_argument<boost::graph::keywords::tag::visitor,_const_boost::detail::components_recorder<boost::associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>_>_>,_boost::parameter::aux::empty_arg_list,_std::integral_constant<bool,_true>_>
  local_58;
  _Rb_tree<void_*,_std::pair<void_*const,_int>,_std::_Select1st<std::pair<void_*const,_int>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
  local_50;
  
  deleteNoiseVertex(this);
  pSVar1 = &(this->graph).super_type.m_vertices;
  p_Var6 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)pSVar1) {
    p_Var3 = (_List_node_base *)0x0;
    p_Var5 = p_Var6;
    do {
      *(_List_node_base **)((long)(p_Var5[1]._M_next + 1) + 8) = p_Var3;
      p_Var3 = (_List_node_base *)((long)&p_Var3->_M_next + 1);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)pSVar1);
  }
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar2 = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>._M_impl.
      _M_node._M_size != 0) {
    local_68 = &local_7c;
    local_7c = 0x7fffffff;
    local_70 = &local_50;
    local_58.arg.value =
         (tagged_argument<boost::graph::keywords::tag::visitor,_const_boost::detail::components_recorder<boost::associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>_>_>
          )&local_78;
    boost::graph::detail::
    depth_first_search_impl<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>>
    ::operator()(&local_7d,&this->graph,&local_58);
    iVar2 = local_7c + 1;
    p_Var6 = (pSVar1->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  this->numberOfClasses = iVar2;
  if (p_Var6 != (_List_node_base *)pSVar1) {
    do {
      local_78 = p_Var6[1]._M_next;
      pmVar4 = std::
               map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>::
               operator[]((map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
                           *)&local_50,&local_78);
      *(mapped_type *)((long)(local_78 + 3) + 8) = *pmVar4;
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)pSVar1);
  }
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_int>,_std::_Select1st<std::pair<void_*const,_int>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void ESOINN::classify()
{
    deleteNoiseVertex();
    size_t index = 0;
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        boost::put(boost::vertex_index, graph, v, index++);
    }
    ComponentMap component;
    boost::associative_property_map<ComponentMap> componentMap(component);
    numberOfClasses = connected_components(graph, componentMap);
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        graph[v].classId = boost::get(componentMap, v);
    }
}